

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O3

void BuilderTests<GrpcLikeMessageBuilder,_GrpcLikeMessageBuilder>::builder_swap_before_finish_test
               (bool run)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  Allocator *pAVar3;
  uint uVar4;
  bool bVar5;
  Offset<MyGame::Example::Monster> root;
  Offset<MyGame::Example::Monster> root_00;
  undefined7 in_register_00000039;
  GrpcLikeMessageBuilder dst;
  GrpcLikeMessageBuilder src;
  string local_160;
  Allocator local_140;
  FlatBufferBuilder local_138;
  Allocator local_b8;
  FlatBufferBuilder local_b0;
  
  if ((int)CONCAT71(in_register_00000039,run) != 0) {
    local_b8._vptr_Allocator = (_func_int **)&PTR__Allocator_001fad28;
    local_b0.buf_.allocator_ = &local_b8;
    local_b0.buf_.own_allocator_ = false;
    local_b0.buf_.initial_size_ = 0x400;
    local_b0.buf_.max_size_ = 0x7fffffff;
    local_b0.buf_.buffer_minalign_ = 8;
    local_b0.buf_.reserved_ = 0;
    local_b0.buf_.size_ = 0;
    local_b0.length_of_64_bit_region_ = 0;
    local_b0.nested = false;
    local_b0.finished = false;
    local_b0.buf_.buf_ = (uint8_t *)0x0;
    local_b0.buf_.cur_._0_6_ = 0;
    local_b0.buf_.cur_._6_2_ = 0;
    local_b0.buf_.scratch_._0_6_ = 0;
    local_b0._78_8_ = 0;
    local_b0.minalign_ = 1;
    local_b0.force_defaults_ = false;
    local_b0.dedup_vtables_ = true;
    local_b0.string_pool = (StringOffsetMap *)0x0;
    root = populate1(&local_b0);
    uVar4 = local_b0.buf_.size_;
    local_140._vptr_Allocator = (_func_int **)&PTR__Allocator_001fad28;
    local_138.buf_.allocator_ = &local_140;
    local_138.buf_.own_allocator_ = false;
    local_138.buf_.initial_size_ = 0x400;
    local_138.buf_.max_size_ = 0x7fffffff;
    local_138.buf_.buffer_minalign_ = 8;
    local_138.buf_.reserved_ = 0;
    local_138.buf_.size_ = 0;
    local_138.length_of_64_bit_region_ = 0;
    local_138.nested = false;
    local_138.finished = false;
    local_138.buf_.buf_ = (uint8_t *)0x0;
    local_138.buf_.cur_._0_6_ = 0;
    local_138.buf_.cur_._6_2_ = 0;
    local_138.buf_.scratch_._0_6_ = 0;
    local_138._78_8_ = 0;
    local_138.minalign_ = 1;
    local_138.force_defaults_ = false;
    local_138.dedup_vtables_ = true;
    local_138.string_pool = (StringOffsetMap *)0x0;
    root_00 = populate2(&local_138);
    uVar2 = local_138.buf_.size_;
    flatbuffers::FlatBufferBuilderImpl<false>::Swap(&local_b0,&local_138);
    bVar5 = local_b0.buf_.own_allocator_;
    pAVar3 = local_b0.buf_.allocator_;
    local_b0.buf_.allocator_ = local_138.buf_.allocator_;
    local_138.buf_.allocator_ = pAVar3;
    local_b0.buf_.own_allocator_ = local_138.buf_.own_allocator_;
    local_138.buf_.own_allocator_ = bVar5;
    flatbuffers::FlatBufferBuilderImpl<false>::Finish(&local_b0,root_00.o,(char *)0x0,false);
    flatbuffers::FlatBufferBuilderImpl<false>::Finish(&local_138,root.o,(char *)0x0,false);
    TestEq<bool,bool>(uVar2 < local_b0.buf_.size_,true,"\'src.GetSize() > size2\' != \'true\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,0xb1,
                      "static void BuilderTests<GrpcLikeMessageBuilder>::builder_swap_before_finish_test(bool) [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
                     );
    TestEq<bool,bool>(uVar4 < local_138.buf_.size_,true,"\'dst.GetSize() > size1\' != \'true\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,0xb2,
                      "static void BuilderTests<GrpcLikeMessageBuilder>::builder_swap_before_finish_test(bool) [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
                     );
    paVar1 = &local_160.field_2;
    local_160.field_2._M_allocated_capacity._0_4_ = 0x706d49;
    local_160._M_string_length = 3;
    local_160._M_dataplus._M_p = (pointer)paVar1;
    bVar5 = release_n_verify(&local_b0,&local_160,Color_Green);
    TestEq<bool,bool>(true,bVar5,"\'true\' != \'release_n_verify(src, m2_name(), m2_color())\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,0xb3,
                      "static void BuilderTests<GrpcLikeMessageBuilder>::builder_swap_before_finish_test(bool) [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
                     );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    local_160.field_2._M_allocated_capacity = 0x6d65647265627943;
    local_160.field_2._8_2_ = 0x6e6f;
    local_160._M_string_length = 10;
    local_160.field_2._M_local_buf[10] = '\0';
    local_160._M_dataplus._M_p = (pointer)paVar1;
    bVar5 = release_n_verify(&local_138,&local_160,Color_Red);
    TestEq<bool,bool>(true,bVar5,"\'true\' != \'release_n_verify(dst, m1_name(), m1_color())\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,0xb4,
                      "static void BuilderTests<GrpcLikeMessageBuilder>::builder_swap_before_finish_test(bool) [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
                     );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_138);
    flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_b0);
  }
  return;
}

Assistant:

static void builder_swap_before_finish_test(
      bool run = std::is_same<DestBuilder, SrcBuilder>::value) {
    /// Swap is allowed only when lhs and rhs are the same concrete type.
    if (run) {
      SrcBuilder src;
      auto root_offset1 = populate1(src);
      auto size1 = src.GetSize();
      DestBuilder dst;
      auto root_offset2 = populate2(dst);
      auto size2 = dst.GetSize();
      src.Swap(dst);
      src.Finish(root_offset2);
      dst.Finish(root_offset1);
      TEST_EQ_FUNC(src.GetSize() > size2, true);
      TEST_EQ_FUNC(dst.GetSize() > size1, true);
      TEST_ASSERT_FUNC(release_n_verify(src, m2_name(), m2_color()));
      TEST_ASSERT_FUNC(release_n_verify(dst, m1_name(), m1_color()));
    }
  }